

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O0

void bloaty::wasm::ReadCodeSection
               (Section *section,IndexedNames *names,uint32_t num_imports,RangeSink *sink)

{
  string_view data_00;
  string_view data_01;
  bool bVar1;
  char *pcVar2;
  const_pointer pvVar3;
  const_pointer pvVar4;
  pointer pvVar5;
  RangeSink *in_RCX;
  int in_EDX;
  long in_RDI;
  undefined1 auVar6 [16];
  string name;
  const_iterator iter;
  uint32_t total_size;
  uint32_t size;
  string_view func;
  uint32_t i;
  uint32_t count;
  string_view data;
  DataSource in_stack_000002ec;
  string_view in_stack_000002f0;
  string *in_stack_fffffffffffffe48;
  RangeSink *in_stack_fffffffffffffe50;
  RangeSink *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  string_view in_stack_fffffffffffffe98;
  string_view in_stack_fffffffffffffea8;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  _Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_a8;
  int local_9c;
  _Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_98;
  size_t local_90;
  char *local_88;
  string_view local_80;
  size_t local_70;
  char *local_68;
  string_view local_60;
  int local_50;
  uint32_t local_4c;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  uint local_38;
  uint local_34;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  RangeSink *local_20;
  int local_14;
  
  local_30._M_len = *(size_t *)(in_RDI + 0x38);
  local_30._M_str = *(char **)(in_RDI + 0x40);
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_34 = ReadVarUInt32((string_view *)0x1cb1a3);
  auVar6._8_8_ = in_stack_fffffffffffffe90;
  auVar6._0_8_ = in_stack_fffffffffffffe88;
  for (local_38 = 0; local_38 < local_34; local_38 = local_38 + 1) {
    local_48._M_len = local_30._M_len;
    local_48._M_str = local_30._M_str;
    local_4c = ReadVarUInt32((string_view *)0x1cb1f6);
    pcVar2 = (char *)(ulong)local_4c;
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_30);
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_48);
    local_50 = (int)pcVar2 + ((int)pvVar3 - (int)pvVar4);
    local_70 = local_48._M_len;
    local_68 = local_48._M_str;
    data_01._M_str = pcVar2;
    data_01._M_len = (size_t)pvVar3;
    local_60 = StrictSubstr(data_01,(size_t)in_stack_fffffffffffffe60,
                            (size_t)in_stack_fffffffffffffe58);
    local_48._M_len = local_60._M_len;
    local_48._M_str = local_60._M_str;
    local_90 = local_30._M_len;
    local_88 = local_30._M_str;
    data_00._M_str = (char *)in_stack_fffffffffffffe60;
    data_00._M_len = (size_t)in_stack_fffffffffffffe58;
    local_80 = StrictSubstr(data_00,(size_t)in_stack_fffffffffffffe50);
    local_30._M_len = local_80._M_len;
    local_30._M_str = local_80._M_str;
    local_9c = local_14 + local_38;
    local_98._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffe48,(key_type *)0x1cb34c);
    local_a8._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffe48);
    bVar1 = std::__detail::operator==(&local_98,&local_a8);
    if (bVar1) {
      in_stack_fffffffffffffe60 = local_108;
      std::__cxx11::to_string((uint)(in_stack_fffffffffffffe78 >> 0x20));
      std::operator+((char *)in_stack_fffffffffffffe58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_108);
      in_stack_fffffffffffffe58 = local_20;
      std::__cxx11::string::operator_cast_to_basic_string_view(local_c8);
      RangeSink::AddFileRange
                (auVar6._8_8_,auVar6._0_8_,in_stack_fffffffffffffea8,in_stack_fffffffffffffe98);
      std::__cxx11::string::~string(local_c8);
    }
    else {
      in_stack_fffffffffffffe50 = local_20;
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                             *)0x1cb4fb);
      auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&pvVar5->second);
      RangeSink::data_source(local_20);
      in_stack_fffffffffffffe48 = (string *)&stack0xfffffffffffffe98;
      ItaniumDemangle_abi_cxx11_(in_stack_000002f0,in_stack_000002ec);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe48);
      in_stack_fffffffffffffe78 = local_48._M_len;
      RangeSink::AddFileRange
                (auVar6._8_8_,auVar6._0_8_,in_stack_fffffffffffffea8,in_stack_fffffffffffffe98);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe98);
    }
  }
  return;
}

Assistant:

void ReadCodeSection(const Section& section, const IndexedNames& names,
                     uint32_t num_imports, RangeSink* sink) {
  string_view data = section.contents;

  uint32_t count = ReadVarUInt32(&data);

  for (uint32_t i = 0; i < count; i++) {
    string_view func = data;
    uint32_t size = ReadVarUInt32(&data);
    uint32_t total_size = size + (data.data() - func.data());

    func = StrictSubstr(func, 0, total_size);
    data = StrictSubstr(data, size);

    auto iter = names.find(num_imports + i);

    if (iter == names.end()) {
      std::string name = "func[" + std::to_string(i) + "]";
      sink->AddFileRange("wasm_function", name, func);
    } else {
      sink->AddFileRange("wasm_function", ItaniumDemangle(iter->second, sink->data_source()), func);
    }
  }
}